

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O1

void trc_infof(Curl_easy *data,curl_trc_feat *feat,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char buffer [2053];
  char local_828 [2056];
  
  if (feat == (curl_trc_feat *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = curl_msnprintf(local_828,0x801,"[%s] ",feat->name);
  }
  iVar2 = curl_mvsnprintf(local_828 + iVar1,(long)(0x801 - iVar1),fmt,ap);
  uVar3 = iVar2 + iVar1;
  if (0x7ff < (int)uVar3) {
    local_828[uVar3 - 1] = '.';
    (local_828 + uVar3)[0] = '.';
    (local_828 + uVar3)[1] = '.';
    uVar3 = uVar3 + 2;
  }
  (local_828 + (int)uVar3)[0] = '\n';
  (local_828 + (int)uVar3)[1] = '\0';
  Curl_debug(data,CURLINFO_TEXT,local_828,(long)(int)uVar3 + 1);
  return;
}

Assistant:

static void trc_infof(struct Curl_easy *data, struct curl_trc_feat *feat,
                      const char * const fmt, va_list ap)
{
  int len = 0;
  char buffer[MAXINFO + 5];
  if(feat)
    len = msnprintf(buffer, (MAXINFO + 1), "[%s] ", feat->name);
  len += mvsnprintf(buffer + len, (MAXINFO + 1) - len, fmt, ap);
  if(len >= MAXINFO) { /* too long, shorten with '...' */
    --len;
    buffer[len++] = '.';
    buffer[len++] = '.';
    buffer[len++] = '.';
  }
  buffer[len++] = '\n';
  buffer[len] = '\0';
  Curl_debug(data, CURLINFO_TEXT, buffer, len);
}